

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xml2_read_toc(archive_read *a)

{
  void *pvVar1;
  xmlattr *pxVar2;
  int iVar3;
  int iVar4;
  enctype eVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  archive_string *as;
  long lVar10;
  time_t tVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  uint *l;
  xar_file *pxVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  xar *pxVar19;
  xmlattr *pxVar20;
  bool bVar21;
  xmlattr_list list;
  xmlattr local_58;
  int local_3c;
  xar_file *local_38;
  
  lVar6 = xmlReaderForIO(xml2_read_cb,xml2_close_cb,a,0,0,0);
  if (lVar6 == 0) {
    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory for xml parser");
    iVar4 = -0x1e;
  }
  else {
    xmlTextReaderSetErrorHandler(lVar6,xml2_error_hdr,a);
switchD_0014ec09_caseD_c:
    iVar3 = xmlTextReaderRead(lVar6);
    if (iVar3 == 1) {
      iVar4 = xmlTextReaderNodeType(lVar6);
      pcVar7 = (char *)xmlTextReaderConstLocalName(lVar6);
      pxVar20 = (xmlattr *)local_58.name;
      if (iVar4 == 0xf) goto LAB_0014ec98;
      if (iVar4 != 3) goto code_r0x0014ea51;
      as = (archive_string *)xmlTextReaderConstValue(lVar6);
      pcVar7 = (char *)strlen((char *)as);
      pvVar1 = a->format->data;
      iVar4 = *(int *)((long)pvVar1 + 0x28);
      if (iVar4 == 6) {
        lVar14 = 0x58;
        if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
LAB_0014ebd9:
          lVar10 = 0;
        }
        else {
          lVar10 = 0;
          pcVar8 = (char *)0x1;
          do {
            lVar10 = (ulong)uVar17 + lVar10 * 10;
            uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
            if (9 < uVar17) break;
            bVar21 = pcVar7 != pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (bVar21);
        }
LAB_0014ebdb:
        *(long *)((long)pvVar1 + lVar14) = lVar10;
      }
      else if (iVar4 == 5) {
        lVar14 = 0x50;
        if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17))
        goto LAB_0014ebd9;
        lVar10 = 0;
        pcVar8 = (char *)0x1;
        do {
          lVar10 = (ulong)uVar17 + lVar10 * 10;
          uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
          if (9 < uVar17) break;
          bVar21 = pcVar7 != pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (bVar21);
        goto LAB_0014ebdb;
      }
      lVar14 = *(long *)((long)pvVar1 + 0x1a0);
      if (lVar14 != 0) {
        l = &switchD_0014ec09::switchdataD_00188ee4;
        switch(iVar4) {
        case 9:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 1;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x28) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 10:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 1;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x30) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0xb:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 1;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x38) = lVar10;
        default:
          goto switchD_0014ec09_caseD_c;
        case 0xd:
          sVar12 = atohex((uchar *)(lVar14 + 0x58),(size_t)as,pcVar7,0x188ee4);
          *(size_t *)(*(long *)((long)pvVar1 + 0x1a0) + 0x50) = sVar12;
          goto switchD_0014ec09_caseD_c;
        case 0xe:
          sVar12 = atohex((uchar *)(lVar14 + 0x80),(size_t)as,pcVar7,0x188ee4);
          *(size_t *)(*(long *)((long)pvVar1 + 0x1a0) + 0x78) = sVar12;
          goto switchD_0014ec09_caseD_c;
        case 0x11:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar14 = 0;
          }
          else {
            lVar14 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar14 = (ulong)uVar17 + lVar14 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(*(long *)((long)pvVar1 + 0x1a8) + 0x28) = lVar14;
          goto switchD_0014ec09_caseD_c;
        case 0x12:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar14 = 0;
          }
          else {
            lVar14 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar14 = (ulong)uVar17 + lVar14 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(*(long *)((long)pvVar1 + 0x1a8) + 0x30) = lVar14;
          goto switchD_0014ec09_caseD_c;
        case 0x13:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar14 = 0;
          }
          else {
            lVar14 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar14 = (ulong)uVar17 + lVar14 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(*(long *)((long)pvVar1 + 0x1a8) + 0x38) = lVar14;
          goto switchD_0014ec09_caseD_c;
        case 0x15:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          sVar12 = atohex((uchar *)(*(long *)((long)pvVar1 + 0x1a8) + 0x58),(size_t)as,pcVar7,
                          0x188ee4);
          *(size_t *)(*(long *)((long)pvVar1 + 0x1a8) + 0x50) = sVar12;
          goto switchD_0014ec09_caseD_c;
        case 0x16:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          sVar12 = atohex((uchar *)(*(long *)((long)pvVar1 + 0x1a8) + 0x80),(size_t)as,pcVar7,
                          0x188ee4);
          *(size_t *)(*(long *)((long)pvVar1 + 0x1a8) + 0x78) = sVar12;
          goto switchD_0014ec09_caseD_c;
        case 0x17:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          lVar14 = *(long *)((long)pvVar1 + 0x1a8);
          *(undefined8 *)(lVar14 + 0x10) = 0;
          pxVar19 = (xar *)(lVar14 + 8);
          break;
        case 0x18:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x20;
          lVar14 = *(long *)((long)pvVar1 + 0x1a8);
          *(undefined8 *)(lVar14 + 0xa0) = 0;
          pxVar19 = (xar *)(lVar14 + 0x98);
          break;
        case 0x19:
          *(uint *)(lVar14 + 0x1c) = *(uint *)(lVar14 + 0x1c) | 0x8008;
          tVar11 = parse_time((char *)as,(size_t)pcVar7);
          *(time_t *)(*(long *)((long)pvVar1 + 0x1a0) + 200) = tVar11;
          goto switchD_0014ec09_caseD_c;
        case 0x1a:
          *(uint *)(lVar14 + 0x1c) = *(uint *)(lVar14 + 0x1c) | 0x10008;
          tVar11 = parse_time((char *)as,(size_t)pcVar7);
          *(time_t *)(*(long *)((long)pvVar1 + 0x1a0) + 0xd0) = tVar11;
          goto switchD_0014ec09_caseD_c;
        case 0x1b:
          *(uint *)(lVar14 + 0x1c) = *(uint *)(lVar14 + 0x1c) | 0x20008;
          tVar11 = parse_time((char *)as,(size_t)pcVar7);
          *(time_t *)(*(long *)((long)pvVar1 + 0x1a0) + 0xd8) = tVar11;
          goto switchD_0014ec09_caseD_c;
        case 0x1c:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 0x20;
          *(undefined8 *)(lVar14 + 0x108) = 0;
          pxVar19 = (xar *)(lVar14 + 0x100);
          break;
        case 0x1d:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 0x20;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x118) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0x1e:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 0x10;
          *(undefined8 *)(lVar14 + 0xe8) = 0;
          pxVar19 = (xar *)(lVar14 + 0xe0);
          break;
        case 0x1f:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 0x10;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0xf8) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0x20:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 0x40;
          if (pcVar7 == (char *)0x0) {
            uVar17 = 0;
          }
          else {
            pcVar8 = (char *)0x0;
            uVar17 = 0;
            do {
              if ((pcVar8[(long)&as->s] & 0xf8U) != 0x30) break;
              uVar17 = (uint)(byte)(pcVar8[(long)&as->s] - 0x30) + uVar17 * 8;
              pcVar8 = pcVar8 + 1;
            } while (pcVar7 != pcVar8);
            uVar17 = uVar17 & 0xffff0fff;
          }
          *(uint *)(lVar14 + 0x120) = *(uint *)(lVar14 + 0x120) & 0xf000 | uVar17;
          goto switchD_0014ec09_caseD_c;
        case 0x22:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 2;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x130) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0x23:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 4;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x138) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0x24:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 1;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x128) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0x25:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 8;
          if ((pcVar7 == (char *)0x0) || (uVar17 = (int)*(char *)&as->s - 0x30, 9 < uVar17)) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0;
            pcVar8 = (char *)0x1;
            do {
              lVar10 = (ulong)uVar17 + lVar10 * 10;
              uVar17 = (int)pcVar8[(long)&as->s] - 0x30;
              if (9 < uVar17) break;
              bVar21 = pcVar7 != pcVar8;
              pcVar8 = pcVar8 + 1;
            } while (bVar21);
          }
          *(long *)(lVar14 + 0x140) = lVar10;
          goto switchD_0014ec09_caseD_c;
        case 0x26:
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 4;
          *(undefined8 *)(lVar14 + 0xb8) = 0;
          pxVar19 = (xar *)(lVar14 + 0xb0);
          break;
        case 0x27:
          switch(pcVar7) {
          case (char *)0x4:
            if (*(int *)&as->s == 0x656c6966) {
              *(uint *)(lVar14 + 0x120) = *(uint *)(lVar14 + 0x120) & 0xffff0fff | 0x8000;
            }
            iVar4 = bcmp(as,"fifo",(size_t)pcVar7);
            if (iVar4 == 0) {
              uVar17 = 0x1000;
LAB_0014f9ef:
              *(uint *)(lVar14 + 0x120) = *(uint *)(lVar14 + 0x120) & 0xffff0fff | uVar17;
            }
            break;
          case (char *)0x6:
            iVar4 = bcmp(as,"socket",(size_t)pcVar7);
            if (iVar4 == 0) {
              uVar17 = 0xc000;
              goto LAB_0014f9ef;
            }
            break;
          case (char *)0x7:
            iVar4 = bcmp(as,"symlink",(size_t)pcVar7);
            if (iVar4 == 0) {
              uVar17 = 0xa000;
              goto LAB_0014f9ef;
            }
            break;
          case (char *)0x8:
            iVar4 = bcmp(as,"hardlink",(size_t)pcVar7);
            if (iVar4 == 0) {
              uVar17 = 0x8000;
              goto LAB_0014f9ef;
            }
            break;
          case (char *)0x9:
            if ((char)as->length == 'y' && as->s == (char *)0x726f746365726964) {
              uVar17 = 0x4000;
              goto LAB_0014f9ef;
            }
            break;
          case (char *)0xd:
            iVar4 = bcmp(as,"block special",(size_t)pcVar7);
            if (iVar4 == 0) {
              uVar17 = 0x6000;
              goto LAB_0014f9ef;
            }
            break;
          case (char *)0x11:
            iVar4 = bcmp(as,"character special",(size_t)pcVar7);
            if (iVar4 == 0) {
              uVar17 = 0x2000;
              goto LAB_0014f9ef;
            }
          }
          *(byte *)(lVar14 + 0x1c) = *(byte *)(lVar14 + 0x1c) | 0x80;
          goto switchD_0014ec09_caseD_c;
        case 0x28:
          uVar17 = *(uint *)(lVar14 + 0x1c);
          if ((uVar17 & 2) != 0) goto switchD_0014ec09_caseD_c;
          if (*(long *)(lVar14 + 0x10) != 0) {
            archive_string_concat
                      ((archive_string *)(lVar14 + 0x98),
                       (archive_string *)(*(long *)(lVar14 + 0x10) + 0x98));
            archive_strappend_char((archive_string *)(*(long *)((long)pvVar1 + 0x1a0) + 0x98),'/');
            lVar14 = *(long *)((long)pvVar1 + 0x1a0);
            uVar17 = *(uint *)(lVar14 + 0x1c);
          }
          *(uint *)(lVar14 + 0x1c) = uVar17 | 2;
          pxVar19 = (xar *)(lVar14 + 0x98);
          if (*(int *)((long)pvVar1 + 0x38) != 0) {
            strappend_base64(pxVar19,as,pcVar7,(size_t)l);
            goto switchD_0014ec09_caseD_c;
          }
          break;
        case 0x2a:
        case 0x2b:
        case 0x2c:
          *(byte *)(lVar14 + 0x1d) = *(byte *)(lVar14 + 0x1d) | 0x40;
          goto switchD_0014ec09_caseD_c;
        }
        archive_strncat((archive_string *)pxVar19,as,(size_t)pcVar7);
      }
      goto switchD_0014ec09_caseD_c;
    }
    xmlFreeTextReader(lVar6);
    xmlCleanupParser();
    iVar4 = -0x1e;
    if (iVar3 == 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
code_r0x0014ea51:
  if (iVar4 != 1) goto switchD_0014ec09_caseD_c;
  iVar3 = xmlTextReaderIsEmptyElement(lVar6);
  local_58.next = (xmlattr *)0x0;
  local_58.name = (char *)&local_58;
  iVar4 = xmlTextReaderMoveToFirstAttribute(lVar6);
  local_3c = iVar3;
  while (iVar4 == 1) {
    pcVar8 = (char *)malloc(0x18);
    if (pcVar8 == (char *)0x0) {
LAB_0014ec27:
      iVar4 = 0xc;
      pcVar8 = "Out of memory";
      goto LAB_0014ec36;
    }
    pcVar9 = (char *)xmlTextReaderConstLocalName(lVar6);
    pcVar9 = strdup(pcVar9);
    *(char **)(pcVar8 + 8) = pcVar9;
    if (pcVar9 == (char *)0x0) {
LAB_0014ec1f:
      free(pcVar8);
      goto LAB_0014ec27;
    }
    pcVar9 = (char *)xmlTextReaderConstValue(lVar6);
    pcVar9 = strdup(pcVar9);
    *(char **)(pcVar8 + 0x10) = pcVar9;
    if (pcVar9 == (char *)0x0) {
      free(*(void **)(pcVar8 + 8));
      goto LAB_0014ec1f;
    }
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    pcVar8[4] = '\0';
    pcVar8[5] = '\0';
    pcVar8[6] = '\0';
    pcVar8[7] = '\0';
    *(char **)local_58.name = pcVar8;
    local_58.name = pcVar8;
    iVar4 = xmlTextReaderMoveToNextAttribute(lVar6);
  }
  pxVar20 = local_58.next;
  if (iVar4 != 0) goto joined_r0x0014ec4a;
  pxVar19 = (xar *)a->format->data;
  pxVar19->base64text = 0;
  switch(pxVar19->xmlsts) {
  case INIT:
    iVar4 = strcmp(pcVar7,"xar");
    if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
    pxVar19->xmlsts = XAR;
    break;
  case XAR:
    iVar4 = strcmp(pcVar7,"toc");
    if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
    pxVar19->xmlsts = TOC;
    break;
  case TOC:
    iVar4 = strcmp(pcVar7,"creation-time");
    if (iVar4 == 0) {
      pxVar19->xmlsts = TOC_CREATION_TIME;
    }
    else {
      iVar4 = strcmp(pcVar7,"checksum");
      if (iVar4 == 0) {
        pxVar19->xmlsts = TOC_CHECKSUM;
      }
      else {
        iVar4 = strcmp(pcVar7,"file");
        if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
        iVar3 = file_new(a,pxVar19,(xmlattr_list *)&local_58);
        iVar4 = -0x1e;
        pxVar20 = local_58.next;
        if (iVar3 != 0) goto joined_r0x0014ec4a;
        pxVar19->xmlsts = TOC_FILE;
      }
    }
    break;
  case TOC_CREATION_TIME:
  case TOC_CHECKSUM_OFFSET:
  case TOC_CHECKSUM_SIZE:
  case FILE_DATA_LENGTH:
  case FILE_DATA_OFFSET:
  case FILE_DATA_SIZE:
  case FILE_DATA_ENCODING:
  case FILE_DATA_A_CHECKSUM:
  case FILE_DATA_E_CHECKSUM:
  case FILE_DATA_CONTENT:
  case FILE_EA_LENGTH:
  case FILE_EA_OFFSET:
  case FILE_EA_SIZE:
  case FILE_EA_ENCODING:
  case FILE_EA_A_CHECKSUM:
  case FILE_EA_E_CHECKSUM:
  case FILE_EA_NAME:
  case FILE_EA_FSTYPE:
  case FILE_CTIME:
  case FILE_MTIME:
  case FILE_ATIME:
  case FILE_GROUP:
  case FILE_GID:
  case FILE_USER:
  case FILE_UID:
  case FILE_MODE:
  case FILE_DEVICE_MAJOR:
  case FILE_DEVICE_MINOR:
  case FILE_DEVICENO:
  case FILE_INODE:
  case FILE_LINK:
  case FILE_TYPE:
  case FILE_NAME:
  case FILE_ACL_DEFAULT:
  case FILE_ACL_ACCESS:
  case FILE_ACL_APPLEEXTENDED:
  case FILE_FLAGS_USER_NODUMP:
  case FILE_FLAGS_USER_IMMUTABLE:
  case FILE_FLAGS_USER_APPEND:
  case FILE_FLAGS_USER_OPAQUE:
  case FILE_FLAGS_USER_NOUNLINK:
  case FILE_FLAGS_SYS_ARCHIVED:
  case FILE_FLAGS_SYS_IMMUTABLE:
  case FILE_FLAGS_SYS_APPEND:
  case FILE_FLAGS_SYS_NOUNLINK:
  case FILE_FLAGS_SYS_SNAPSHOT:
  case FILE_EXT2_SecureDeletion:
  case FILE_EXT2_Undelete:
  case FILE_EXT2_Compress:
  case FILE_EXT2_Synchronous:
  case FILE_EXT2_Immutable:
  case FILE_EXT2_AppendOnly:
  case FILE_EXT2_NoDump:
  case FILE_EXT2_NoAtime:
  case FILE_EXT2_CompDirty:
  case FILE_EXT2_CompBlock:
  case FILE_EXT2_NoCompBlock:
  case FILE_EXT2_CompError:
  case FILE_EXT2_BTree:
  case FILE_EXT2_HashIndexed:
  case FILE_EXT2_iMagic:
  case FILE_EXT2_Journaled:
  case FILE_EXT2_NoTail:
  case FILE_EXT2_DirSync:
  case FILE_EXT2_TopDir:
  case FILE_EXT2_Reserved:
  case UNKNOWN:
    goto switchD_0014eb29_caseD_3;
  case TOC_CHECKSUM:
    iVar4 = strcmp(pcVar7,"offset");
    if (iVar4 == 0) {
      pxVar19->xmlsts = TOC_CHECKSUM_OFFSET;
    }
    else {
      iVar4 = strcmp(pcVar7,"size");
      if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
      pxVar19->xmlsts = TOC_CHECKSUM_SIZE;
    }
    break;
  case TOC_FILE:
    iVar4 = strcmp(pcVar7,"file");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar7,"data");
      if (iVar4 == 0) {
        pxVar19->xmlsts = FILE_DATA;
      }
      else if (((*pcVar7 == 'e') && (pcVar7[1] == 'a')) && (pcVar7[2] == '\0')) {
        iVar3 = xattr_new(a,pxVar19,(xmlattr_list *)&local_58);
        iVar4 = -0x1e;
        pxVar20 = local_58.next;
        if (iVar3 != 0) goto joined_r0x0014ec4a;
        pxVar19->xmlsts = FILE_EA;
      }
      else {
        iVar4 = strcmp(pcVar7,"ctime");
        if (iVar4 == 0) {
          pxVar19->xmlsts = FILE_CTIME;
        }
        else {
          iVar4 = strcmp(pcVar7,"mtime");
          if (iVar4 == 0) {
            pxVar19->xmlsts = FILE_MTIME;
          }
          else {
            iVar4 = strcmp(pcVar7,"atime");
            if (iVar4 == 0) {
              pxVar19->xmlsts = FILE_ATIME;
            }
            else {
              iVar4 = strcmp(pcVar7,"group");
              if (iVar4 == 0) {
                pxVar19->xmlsts = FILE_GROUP;
              }
              else {
                iVar4 = strcmp(pcVar7,"gid");
                if (iVar4 == 0) {
                  pxVar19->xmlsts = FILE_GID;
                }
                else {
                  iVar4 = strcmp(pcVar7,"user");
                  if (iVar4 == 0) {
                    pxVar19->xmlsts = FILE_USER;
                  }
                  else {
                    iVar4 = strcmp(pcVar7,"uid");
                    if (iVar4 == 0) {
                      pxVar19->xmlsts = FILE_UID;
                    }
                    else {
                      iVar4 = strcmp(pcVar7,"mode");
                      if (iVar4 == 0) {
                        pxVar19->xmlsts = FILE_MODE;
                      }
                      else {
                        iVar4 = strcmp(pcVar7,"device");
                        if (iVar4 == 0) {
                          pxVar19->xmlsts = FILE_DEVICE;
                        }
                        else {
                          iVar4 = strcmp(pcVar7,"deviceno");
                          if (iVar4 == 0) {
                            pxVar19->xmlsts = FILE_DEVICENO;
                          }
                          else {
                            iVar4 = strcmp(pcVar7,"inode");
                            if (iVar4 == 0) {
                              pxVar19->xmlsts = FILE_INODE;
                            }
                            else {
                              iVar4 = strcmp(pcVar7,"link");
                              if (iVar4 == 0) {
                                pxVar19->xmlsts = FILE_LINK;
                              }
                              else {
                                iVar4 = strcmp(pcVar7,"type");
                                if (iVar4 == 0) {
                                  pxVar19->xmlsts = FILE_TYPE;
                                  for (pxVar20 = local_58.next; pxVar20 != (xmlattr *)0x0;
                                      pxVar20 = pxVar20->next) {
                                    iVar4 = strcmp(pxVar20->name,"link");
                                    if (iVar4 != 0) goto LAB_0014fc7e;
                                    local_58.value = (char *)pxVar19->file;
                                    if (((((xar_file *)local_58.value)->hdnext != (xar_file *)0x0)
                                        || (((xar_file *)local_58.value)->link != 0)) ||
                                       (local_38 = pxVar19->hdlink_orgs,
                                       (xar_file *)local_58.value == local_38)) {
                                      iVar4 = -1;
                                      pcVar8 = "File with multiple link attributes";
LAB_0014ec36:
                                      archive_set_error(&a->archive,iVar4,pcVar8);
LAB_0014ec3d:
                                      iVar4 = -0x1e;
                                      pxVar20 = local_58.next;
                                      goto joined_r0x0014ec4a;
                                    }
                                    pcVar8 = pxVar20->value;
                                    iVar4 = strcmp(pcVar8,"original");
                                    if (iVar4 == 0) {
                                      *(xar_file **)((long)local_58.value + 8) = local_38;
                                      pxVar19->hdlink_orgs = (xar_file *)local_58.value;
                                    }
                                    else {
                                      sVar13 = strlen(pcVar8);
                                      if ((sVar13 != 0) &&
                                         (uVar17 = (int)*pcVar8 - 0x30, uVar17 < 10)) {
                                        uVar16 = 0;
                                        sVar18 = 1;
                                        do {
                                          uVar16 = uVar17 + uVar16 * 10;
                                          uVar17 = (int)pcVar8[sVar18] - 0x30;
                                          if (9 < uVar17) break;
                                          bVar21 = sVar13 != sVar18;
                                          sVar18 = sVar18 + 1;
                                        } while (bVar21);
                                        *(uint *)((long)local_58.value + 0x160) = uVar16;
                                        if ((uVar16 == 0) ||
                                           (iVar4 = add_link(a,pxVar19,(xar_file *)local_58.value),
                                           iVar4 == 0)) goto LAB_0014fc7e;
                                        goto LAB_0014ec3d;
                                      }
                                      *(uint *)((long)local_58.value + 0x160) = 0;
                                    }
LAB_0014fc7e:
                                  }
                                }
                                else {
                                  iVar4 = strcmp(pcVar7,"name");
                                  if (iVar4 == 0) {
                                    pxVar19->xmlsts = FILE_NAME;
                                    for (pxVar20 = local_58.next; pxVar20 != (xmlattr *)0x0;
                                        pxVar20 = pxVar20->next) {
                                      iVar4 = strcmp(pxVar20->name,"enctype");
                                      if ((iVar4 == 0) &&
                                         (iVar4 = strcmp(pxVar20->value,"base64"), iVar4 == 0)) {
                                        pxVar19->base64text = 1;
                                      }
                                    }
                                  }
                                  else {
                                    iVar4 = strcmp(pcVar7,"acl");
                                    if (iVar4 == 0) {
                                      pxVar19->xmlsts = FILE_ACL;
                                    }
                                    else {
                                      iVar4 = strcmp(pcVar7,"flags");
                                      if (iVar4 == 0) {
                                        pxVar19->xmlsts = FILE_FLAGS;
                                      }
                                      else {
                                        iVar4 = strcmp(pcVar7,"ext2");
                                        if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
                                        pxVar19->xmlsts = FILE_EXT2;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
    iVar3 = file_new(a,pxVar19,(xmlattr_list *)&local_58);
    goto LAB_0014eb39;
  case FILE_DATA:
    iVar4 = strcmp(pcVar7,"length");
    if (iVar4 == 0) {
      pxVar19->xmlsts = FILE_DATA_LENGTH;
    }
    else {
      iVar4 = strcmp(pcVar7,"offset");
      if (iVar4 == 0) {
        pxVar19->xmlsts = FILE_DATA_OFFSET;
      }
      else {
        iVar4 = strcmp(pcVar7,"size");
        if (iVar4 == 0) {
          pxVar19->xmlsts = FILE_DATA_SIZE;
        }
        else {
          iVar4 = strcmp(pcVar7,"encoding");
          if (iVar4 == 0) {
            pxVar19->xmlsts = FILE_DATA_ENCODING;
            eVar5 = getencoding((xmlattr_list *)&local_58);
            pxVar15 = pxVar19->file;
LAB_0014fb1c:
            pxVar15->encoding = eVar5;
          }
          else {
            iVar4 = strcmp(pcVar7,"archived-checksum");
            if (iVar4 == 0) {
              pxVar19->xmlsts = FILE_DATA_A_CHECKSUM;
              iVar4 = getsumalgorithm((xmlattr_list *)&local_58);
              (pxVar19->file->a_sum).alg = iVar4;
            }
            else {
              iVar4 = strcmp(pcVar7,"extracted-checksum");
              if (iVar4 == 0) {
                pxVar19->xmlsts = FILE_DATA_E_CHECKSUM;
                iVar4 = getsumalgorithm((xmlattr_list *)&local_58);
                (pxVar19->file->e_sum).alg = iVar4;
              }
              else {
                iVar4 = strcmp(pcVar7,"content");
                if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
                pxVar19->xmlsts = FILE_DATA_CONTENT;
              }
            }
          }
        }
      }
    }
    break;
  case FILE_EA:
    iVar4 = strcmp(pcVar7,"length");
    if (iVar4 == 0) {
      pxVar19->xmlsts = FILE_EA_LENGTH;
    }
    else {
      iVar4 = strcmp(pcVar7,"offset");
      if (iVar4 == 0) {
        pxVar19->xmlsts = FILE_EA_OFFSET;
      }
      else {
        iVar4 = strcmp(pcVar7,"size");
        if (iVar4 == 0) {
          pxVar19->xmlsts = FILE_EA_SIZE;
        }
        else {
          iVar4 = strcmp(pcVar7,"encoding");
          if (iVar4 == 0) {
            pxVar19->xmlsts = FILE_EA_ENCODING;
            eVar5 = getencoding((xmlattr_list *)&local_58);
            pxVar15 = (xar_file *)pxVar19->xattr;
            goto LAB_0014fb1c;
          }
          iVar4 = strcmp(pcVar7,"archived-checksum");
          if (iVar4 == 0) {
            pxVar19->xmlsts = FILE_EA_A_CHECKSUM;
          }
          else {
            iVar4 = strcmp(pcVar7,"extracted-checksum");
            if (iVar4 == 0) {
              pxVar19->xmlsts = FILE_EA_E_CHECKSUM;
            }
            else {
              iVar4 = strcmp(pcVar7,"name");
              if (iVar4 == 0) {
                pxVar19->xmlsts = FILE_EA_NAME;
              }
              else {
                iVar4 = strcmp(pcVar7,"fstype");
                if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
                pxVar19->xmlsts = FILE_EA_FSTYPE;
              }
            }
          }
        }
      }
    }
    break;
  case FILE_DEVICE:
    iVar4 = strcmp(pcVar7,"major");
    if (iVar4 == 0) {
      pxVar19->xmlsts = FILE_DEVICE_MAJOR;
    }
    else {
      iVar4 = strcmp(pcVar7,"minor");
      if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
      pxVar19->xmlsts = FILE_DEVICE_MINOR;
    }
    break;
  case FILE_ACL:
    iVar4 = strcmp(pcVar7,"appleextended");
    if (iVar4 == 0) {
      pxVar19->xmlsts = FILE_ACL_APPLEEXTENDED;
    }
    else {
      iVar4 = strcmp(pcVar7,"default");
      if (iVar4 == 0) {
        pxVar19->xmlsts = FILE_ACL_DEFAULT;
      }
      else {
        iVar4 = strcmp(pcVar7,"access");
        if (iVar4 != 0) goto switchD_0014eb29_caseD_3;
        pxVar19->xmlsts = FILE_ACL_ACCESS;
      }
    }
    break;
  case FILE_FLAGS:
    iVar4 = xml_parse_file_flags(pxVar19,pcVar7);
    goto LAB_0014f926;
  case FILE_EXT2:
    iVar4 = xml_parse_file_ext2(pxVar19,pcVar7);
LAB_0014f926:
    if (iVar4 == 0) {
switchD_0014eb29_caseD_3:
      iVar3 = unknowntag_start(a,pxVar19,pcVar7);
LAB_0014eb39:
      iVar4 = -0x1e;
      pxVar20 = local_58.next;
      if (iVar3 != 0) goto joined_r0x0014ec4a;
    }
  }
  iVar4 = 0;
  pxVar20 = local_58.next;
joined_r0x0014ec4a:
  while (pxVar20 != (xmlattr *)0x0) {
    pxVar2 = pxVar20->next;
    free(pxVar20->name);
    free(pxVar20->value);
    free(pxVar20);
    pxVar20 = pxVar2;
  }
  local_58.next = (xmlattr *)0x0;
  if (iVar4 != 0) {
    local_58.name = (char *)&local_58;
    xmlFreeTextReader(lVar6);
    xmlCleanupParser();
    return iVar4;
  }
  local_58.name = (char *)&local_58;
  pxVar20 = &local_58;
  if (local_3c != 0) {
LAB_0014ec98:
    local_58.name = (char *)pxVar20;
    xml_end(a->format->data,pcVar7);
  }
  goto switchD_0014ec09_caseD_c;
}

Assistant:

static int
xml2_read_toc(struct archive_read *a)
{
	xmlTextReaderPtr reader;
	struct xmlattr_list list;
	int r;

	reader = xmlReaderForIO(xml2_read_cb, xml2_close_cb, a, NULL, NULL, 0);
	if (reader == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Couldn't allocate memory for xml parser");
		return (ARCHIVE_FATAL);
	}
	xmlTextReaderSetErrorHandler(reader, xml2_error_hdr, a);

	while ((r = xmlTextReaderRead(reader)) == 1) {
		const char *name, *value;
		int type, empty;

		type = xmlTextReaderNodeType(reader);
		name = (const char *)xmlTextReaderConstLocalName(reader);
		switch (type) {
		case XML_READER_TYPE_ELEMENT:
			empty = xmlTextReaderIsEmptyElement(reader);
			r = xml2_xmlattr_setup(a, &list, reader);
			if (r == ARCHIVE_OK)
				r = xml_start(a, name, &list);
			xmlattr_cleanup(&list);
			if (r != ARCHIVE_OK) {
				xmlFreeTextReader(reader);
				xmlCleanupParser();
				return (r);
			}
			if (empty)
				xml_end(a, name);
			break;
		case XML_READER_TYPE_END_ELEMENT:
			xml_end(a, name);
			break;
		case XML_READER_TYPE_TEXT:
			value = (const char *)xmlTextReaderConstValue(reader);
			xml_data(a, value, strlen(value));
			break;
		case XML_READER_TYPE_SIGNIFICANT_WHITESPACE:
		default:
			break;
		}
		if (r < 0)
			break;
	}
	xmlFreeTextReader(reader);
	xmlCleanupParser();

	return ((r == 0)?ARCHIVE_OK:ARCHIVE_FATAL);
}